

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_ffh_tonumber(lua_State *L)

{
  byte bVar1;
  byte bVar2;
  CTState *cts;
  int32_t __base;
  int iVar3;
  uint uVar4;
  byte *in_RAX;
  TValue *o;
  GCstr *pGVar5;
  ulong uVar6;
  CType *pCVar7;
  TValue TVar8;
  undefined1 *puVar9;
  byte *__nptr;
  lua_Number lVar10;
  undefined1 auVar11 [16];
  byte *local_38;
  
  local_38 = in_RAX;
  __base = lj_lib_optint(L,2,10);
  if (__base == 10) {
    o = lj_lib_checkany(L,1);
    TVar8 = (TValue)o->u64;
    if ((ulong)(TVar8.it64 >> 0x2f) < 0xfffffffffffffff3) {
LAB_00155579:
      L->base[-2] = TVar8;
      return 2;
    }
    if (TVar8.it64 >> 0x2f == 0xfffffffffffffffb) {
      iVar3 = lj_strscan_num((GCstr *)(TVar8.u64 & 0x7fffffffffff),o);
      TVar8 = (TValue)*(TValue *)&o->field_4;
      if (iVar3 != 0) goto LAB_00155579;
    }
    if (TVar8.field_4.it >> 0xf == 0x1fff5) {
      cts = *(CTState **)((L->glref).ptr64 + 0x180);
      cts->L = L;
      pCVar7 = lj_ctype_rawref(cts,(uint)*(ushort *)((o->u64 & 0x7fffffffffff) + 10));
      uVar4 = pCVar7->info;
      if ((uVar4 & 0xf0000000) == 0x50000000) {
        uVar4 = cts->tab[uVar4 & 0xffff].info;
      }
      if (uVar4 < 0x10000000 || (uVar4 & 0xf4000000) == 0x34000000) {
        lj_cconv_ct_tv(cts,cts->tab + 0xe,(uint8_t *)&L->base[-2].u64,o,0);
        return 2;
      }
    }
  }
  else {
    pGVar5 = lj_lib_checkstr(L,1);
    if (__base - 0x25U < 0xffffffdd) {
      lj_err_arg(L,2,LJ_ERR_BASERNG);
    }
    puVar9 = (undefined1 *)((long)&pGVar5->len + 3);
    do {
      bVar1 = puVar9[1];
      puVar9 = puVar9 + 1;
    } while ((""[(ulong)bVar1 + 1] & 2) != 0);
    __nptr = puVar9 + ((bVar1 - 0x2b & 0xfd) == 0);
    if (((""[(ulong)*__nptr + 1] & 0x68) != 0) &&
       (uVar6 = strtoul((char *)__nptr,(char **)&local_38,__base), __nptr != local_38)) {
      do {
        bVar2 = *local_38;
        local_38 = local_38 + 1;
      } while ((""[(ulong)bVar2 + 1] & 2) != 0);
      if (bVar2 == 0) {
        auVar11._8_4_ = (int)(uVar6 >> 0x20);
        auVar11._0_8_ = uVar6;
        auVar11._12_4_ = 0x45300000;
        lVar10 = ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0) +
                 (auVar11._8_8_ - 1.9342813113834067e+25);
        if (bVar1 == 0x2d) {
          lVar10 = -lVar10;
        }
        L->base[-2].n = lVar10;
        return 2;
      }
    }
  }
  L->base[-2].u64 = 0xffffffffffffffff;
  return 2;
}

Assistant:

LJLIB_ASM(tonumber)		LJLIB_REC(.)
{
  int32_t base = lj_lib_optint(L, 2, 10);
  if (base == 10) {
    TValue *o = lj_lib_checkany(L, 1);
    if (lj_strscan_numberobj(o)) {
      copyTV(L, L->base-1-LJ_FR2, o);
      return FFH_RES(1);
    }
#if LJ_HASFFI
    if (tviscdata(o)) {
      CTState *cts = ctype_cts(L);
      CType *ct = lj_ctype_rawref(cts, cdataV(o)->ctypeid);
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info) || ctype_iscomplex(ct->info)) {
	if (LJ_DUALNUM && ctype_isinteger_or_bool(ct->info) &&
	    ct->size <= 4 && !(ct->size == 4 && (ct->info & CTF_UNSIGNED))) {
	  int32_t i;
	  lj_cconv_ct_tv(cts, ctype_get(cts, CTID_INT32), (uint8_t *)&i, o, 0);
	  setintV(L->base-1-LJ_FR2, i);
	  return FFH_RES(1);
	}
	lj_cconv_ct_tv(cts, ctype_get(cts, CTID_DOUBLE),
		       (uint8_t *)&(L->base-1-LJ_FR2)->n, o, 0);
	return FFH_RES(1);
      }
    }
#endif
  } else {
    const char *p = strdata(lj_lib_checkstr(L, 1));
    char *ep;
    unsigned int neg = 0;
    unsigned long ul;
    if (base < 2 || base > 36)
      lj_err_arg(L, 2, LJ_ERR_BASERNG);
    while (lj_char_isspace((unsigned char)(*p))) p++;
    if (*p == '-') { p++; neg = 1; } else if (*p == '+') { p++; }
    if (lj_char_isalnum((unsigned char)(*p))) {
      ul = strtoul(p, &ep, base);
      if (p != ep) {
	while (lj_char_isspace((unsigned char)(*ep))) ep++;
	if (*ep == '\0') {
	  if (LJ_DUALNUM && LJ_LIKELY(ul < 0x80000000u+neg)) {
	    if (neg) ul = (unsigned long)-(long)ul;
	    setintV(L->base-1-LJ_FR2, (int32_t)ul);
	  } else {
	    lua_Number n = (lua_Number)ul;
	    if (neg) n = -n;
	    setnumV(L->base-1-LJ_FR2, n);
	  }
	  return FFH_RES(1);
	}
      }
    }
  }
  setnilV(L->base-1-LJ_FR2);
  return FFH_RES(1);
}